

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpGCTest_Collect_Basic_Test::TestBody(InterpGCTest_Collect_Basic_Test *this)

{
  Store *this_00;
  char *pcVar1;
  AssertionResult gtest_ar;
  Index after_new;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  void *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  RefPtr<wabt::interp::Foreign> local_48;
  AssertHelper local_28;
  unsigned_long local_20;
  
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_;
  local_58 = (void *)0x0;
  wabt::interp::Store::Alloc<wabt::interp::Foreign,wabt::interp::Store&,void*&>
            (&local_48,this_00,this_00,&local_58);
  local_20 = ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                             ._M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                    super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) -
             (this->super_InterpGCTest).super_InterpTest.store_.objects_.free_items_;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 1);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"before_new + 1","after_new",(unsigned_long *)&local_60,&local_20
            );
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x248,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (local_48.obj_ != (Foreign *)0x0) {
    wabt::interp::Store::DeleteRoot(local_48.store_,local_48.root_index_);
    local_48.obj_ = (Foreign *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                        ._M_impl + 8) -
         (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) -
       (this->super_InterpGCTest).super_InterpTest.store_.objects_.free_items_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"after_new","store_.object_count()",&local_20,
             (unsigned_long *)&local_60);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x24c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (local_48.obj_ != (Foreign *)0x0) {
    wabt::interp::Store::DeleteRoot(local_48.store_,local_48.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Basic) {
  auto foreign = Foreign::New(store_, nullptr);
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 1, after_new);

  // Remove root, but object is not destroyed until collect.
  foreign.reset();
  EXPECT_EQ(after_new, store_.object_count());
}